

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerExpression.hpp
# Opt level: O3

string * __thiscall
Kandinsky::PowerExpression::toString_abi_cxx11_
          (string *__return_storage_ptr__,PowerExpression *this,bool evaluate)

{
  undefined8 *puVar1;
  element_type *peVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (*((this->super_BinaryExpression).m_arg1.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[5])(local_48);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x118455);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_58 = *plVar6;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar6;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_98 = *puVar7;
    uStack_90 = (undefined4)plVar4[3];
    uStack_8c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar7;
    local_a8 = (ulong *)*plVar4;
  }
  local_a0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  peVar2 = (this->super_BinaryExpression).m_arg2.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_BaseExpression[5])(&local_88,peVar2,evaluate);
  uVar9 = 0xf;
  if (local_a8 != &local_98) {
    uVar9 = local_98;
  }
  if (uVar9 < (ulong)(local_80 + local_a0)) {
    uVar9 = 0xf;
    if (local_88 != local_78) {
      uVar9 = local_78[0];
    }
    if ((ulong)(local_80 + local_a0) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_0011361b;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
LAB_0011361b:
  local_c8 = &local_b8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = puVar5[3];
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (undefined8 *)*puVar5;
  }
  local_c0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return "pow(" + m_arg1->toString(evaluate) + ", " + m_arg2->toString(evaluate) + ")";
        }